

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O3

QPDF_BOOL qpdf_oh_get_value_as_real(qpdf_data qpdf,qpdf_oh oh,char **value,size_t *length)

{
  int iVar1;
  function<int_()> local_68;
  _Any_data local_48;
  code *local_38;
  code *pcStack_30;
  
  local_68.super__Function_base._M_functor._8_8_ = 0;
  local_68.super__Function_base._M_functor._M_unused._M_object = return_false;
  local_68._M_invoker = std::_Function_handler<int_(),_int_(*)()>::_M_invoke;
  local_68.super__Function_base._M_manager = std::_Function_handler<int_(),_int_(*)()>::_M_manager;
  local_48._M_unused._M_object = (void *)0x0;
  local_48._8_8_ = 0;
  local_38 = (code *)0x0;
  pcStack_30 = (code *)0x0;
  local_48._M_unused._M_object = operator_new(0x18);
  *(qpdf_data *)local_48._M_unused._0_8_ = qpdf;
  *(char ***)((long)local_48._M_unused._0_8_ + 8) = value;
  *(size_t **)((long)local_48._M_unused._0_8_ + 0x10) = length;
  pcStack_30 = std::
               _Function_handler<int_(QPDFObjectHandle_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf-c.cc:1253:33)>
               ::_M_invoke;
  local_38 = std::
             _Function_handler<int_(QPDFObjectHandle_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf-c.cc:1253:33)>
             ::_M_manager;
  iVar1 = do_with_oh<int>(qpdf,oh,&local_68,(function<int_(QPDFObjectHandle_&)> *)&local_48);
  if (local_38 != (code *)0x0) {
    (*local_38)(&local_48,&local_48,__destroy_functor);
  }
  if (local_68.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_68.super__Function_base._M_manager)
              ((_Any_data *)&local_68,(_Any_data *)&local_68,__destroy_functor);
  }
  return iVar1;
}

Assistant:

QPDF_BOOL
qpdf_oh_get_value_as_real(qpdf_data qpdf, qpdf_oh oh, char const** value, size_t* length)
{
    return do_with_oh<QPDF_BOOL>(
        qpdf, oh, return_false, [qpdf, value, length](QPDFObjectHandle& o) {
            QTC::TC("qpdf", "qpdf-c called qpdf_oh_get_value_as_real");
            auto result = o.getValueAsReal(qpdf->tmp_string);
            if (result) {
                *value = qpdf->tmp_string.c_str();
                *length = qpdf->tmp_string.length();
            }
            return result;
        });
}